

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

void map2json_freeTreeMemory(map2json_tree_t *obj)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    map2json_freeTreeMemory((map2json_tree_t *)0x10599b);
    map2json_freeTreeMemory((map2json_tree_t *)0x1059a8);
    map2json_freeTreeMemory((map2json_tree_t *)0x1059b5);
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

static void map2json_freeTreeMemory(map2json_tree_t *obj) {
	DEBUG_PUT("map2json_freeTreeMemory([map2json_t *])... ");

	if ( obj == NULL ) {
		DEBUG_PUT("map2json_freeTreeMemory([map2json_t *])... DONE");
		return;
	}

	map2json_freeTreeMemory(obj->arrayObjects);
	map2json_freeTreeMemory(obj->children);
	map2json_freeTreeMemory(obj->next);

	if ( obj->key != NULL ) {
		free(obj->key);
	}
	free(obj);
	DEBUG_PUT("map2json_freeTreeMemory([map2json_t *])... DONE");
}